

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMultiMap<QGraphicsItem_*,_QGraphicsItem_*>::lowerBound
          (QMultiMap<QGraphicsItem_*,_QGraphicsItem_*> *this,QGraphicsItem **key)

{
  bool bVar1;
  long in_FS_OFFSET;
  QMultiMap<QGraphicsItem_*,_QGraphicsItem_*> copy;
  iterator in_stack_ffffffffffffffb8;
  QMultiMap<QGraphicsItem_*,_QGraphicsItem_*> *in_stack_ffffffffffffffc0;
  undefined1 *local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffffc0->d);
  if (bVar1) {
    QMultiMap(in_stack_ffffffffffffffc0,
              (QMultiMap<QGraphicsItem_*,_QGraphicsItem_*> *)in_stack_ffffffffffffffb8._M_node);
  }
  else {
    memset(&local_18,0,8);
    QMultiMap((QMultiMap<QGraphicsItem_*,_QGraphicsItem_*> *)0x9de70d);
  }
  detach(in_stack_ffffffffffffffc0);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>_>
                *)0x9de721);
  std::
  multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>
  ::lower_bound((multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>
                 *)in_stack_ffffffffffffffb8._M_node,(key_type *)0x9de732);
  iterator::iterator((iterator *)0x9de746,in_stack_ffffffffffffffb8);
  ~QMultiMap((QMultiMap<QGraphicsItem_*,_QGraphicsItem_*> *)0x9de750);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)(iterator)local_10._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator lowerBound(const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMultiMap(); // keep `key` alive across the detach
        detach();
        return iterator(d->m.lower_bound(key));
    }